

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O2

bool __thiscall
cmParsePHPCoverage::ReadCoverageArray(cmParsePHPCoverage *this,istream *in,string *fileName)

{
  cmCTest *pcVar1;
  pointer piVar2;
  cmParsePHPCoverage *this_00;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  cmParsePHPCoverage *pcVar10;
  int iVar11;
  bool bVar12;
  char c;
  int local_1d4;
  int size;
  char buf [4];
  int local_1c8;
  undefined4 uStack_1c4;
  ostringstream cmCTestLog_msg;
  ulong uVar9;
  
  this_00 = (cmParsePHPCoverage *)
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[](&this->Coverage->TotalCoverage,fileName);
  pcVar10 = (cmParsePHPCoverage *)in;
  std::istream::read((char *)in,(long)buf);
  buf = (char  [4])((uint)buf & 0xffffff);
  if (buf == (char  [4])0x3a613b) {
    size = 0;
    ReadInt(pcVar10,in,&size);
    pcVar10 = (cmParsePHPCoverage *)in;
    plVar4 = (long *)std::istream::get((char *)in);
    bVar12 = (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0;
    bVar7 = c != '{' || bVar12;
    if (c != '{' || bVar12) {
      iVar5 = size;
      if (size < 1) {
        iVar5 = 0;
      }
      for (iVar11 = 0; iVar11 != iVar5; iVar11 = iVar11 + 1) {
        ReadUntil(pcVar10,in,':');
        _cmCTestLog_msg = 0;
        ReadInt(pcVar10,in,(int *)&cmCTestLog_msg);
        iVar8 = _cmCTestLog_msg;
        if (_cmCTestLog_msg < 2) {
          iVar8 = 1;
        }
        uVar9 = (ulong)(iVar8 - 1);
        ReadUntil(pcVar10,in,':');
        local_1c8 = 0;
        ReadInt(pcVar10,in,&local_1c8);
        while (piVar2 = (((_Vector_base<int,_std::allocator<int>_> *)&this_00->Coverage)->_M_impl).
                        super__Vector_impl_data._M_start,
              (ulong)((long)this_00->CTest - (long)piVar2 >> 2) <= uVar9) {
          local_1d4 = -1;
          pcVar10 = this_00;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)this_00,&local_1d4);
        }
        iVar8 = local_1c8;
        if (local_1c8 < 1) {
          iVar8 = 0;
        }
        iVar6 = piVar2[uVar9];
        if (iVar6 == -1) {
          iVar6 = 0;
        }
        piVar2[uVar9] = iVar6 + iVar8;
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      std::operator<<((ostream *)&cmCTestLog_msg,"failed to read open {\n");
      pcVar1 = this->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                   ,0x3f,(char *)CONCAT44(uStack_1c4,local_1c8),false);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar3 = std::operator<<((ostream *)&cmCTestLog_msg,
                             "failed to read start of coverage array, found : ");
    poVar3 = std::operator<<(poVar3,buf);
    std::operator<<(poVar3,"\n");
    pcVar1 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmParsePHPCoverage.cxx"
                 ,0x32,(char *)CONCAT44(uStack_1c4,local_1c8),false);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmParsePHPCoverage::ReadCoverageArray(std::istream& in,
                                           std::string const& fileName)
{
  cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector
    = this->Coverage.TotalCoverage[fileName];

  char c;
  char buf[4];
  in.read(buf, 3);
  buf[3] = 0;
  if(strcmp(buf, ";a:") != 0)
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read start of coverage array, found : "
               << buf << "\n");
    return false;
    }
  int size = 0;
  if(!this->ReadInt(in, size))
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read size ");
    return false;
    }
  if(!in.get(c) && c == '{')
    {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "failed to read open {\n");
    return false;
    }
  for(int i =0; i < size; i++)
    {
    this->ReadUntil(in, ':');
    int line = 0;
    this->ReadInt(in, line);
    // ok xdebug may have a bug here
    // it seems to be 1 based but often times
    // seems to have a 0'th line.
    line--;
    if(line < 0)
      {
      line = 0;
      }
    this->ReadUntil(in, ':');
    int value = 0;
    this->ReadInt(in, value);
    // make sure the vector is the right size and is
    // initialized with -1 for each line
    while(coverageVector.size() <= static_cast<size_t>(line) )
      {
      coverageVector.push_back(-1);
      }
    // if value is less than 0, set it to zero
    // TODO figure out the difference between
    // -1 and -2 in xdebug coverage??  For now
    // assume less than 0 is just not covered
    // CDash expects -1 for non executable code (like comments)
    // and 0 for uncovered code, and a positive value
    // for number of times a line was executed
    if(value < 0)
      {
      value = 0;
      }
    // if unset then set it to value
    if(coverageVector[line] == -1)
      {
      coverageVector[line] = value;
      }
    // otherwise increment by value
    else
      {
      coverageVector[line] += value;
      }
    }
  return true;
}